

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void read_wiener_filter(int wiener_win,WienerInfo *wiener_info,WienerInfo *ref_wiener_info,
                       aom_reader *rb)

{
  uint16_t uVar1;
  aom_reader *in_RCX;
  undefined8 *in_RDX;
  short *in_RSI;
  int in_EDI;
  uint16_t in_stack_ffffffffffffffda;
  uint16_t in_stack_ffffffffffffffdc;
  uint16_t in_stack_ffffffffffffffde;
  
  memset(in_RSI,0,0x10);
  memset(in_RSI + 8,0,0x10);
  if (in_EDI == 7) {
    uVar1 = aom_read_primitive_refsubexpfin_
                      (in_RCX,in_stack_ffffffffffffffde,in_stack_ffffffffffffffdc,
                       in_stack_ffffffffffffffda);
    in_RSI[6] = uVar1 - 5;
    *in_RSI = uVar1 - 5;
  }
  else {
    in_RSI[6] = 0;
    *in_RSI = 0;
  }
  uVar1 = aom_read_primitive_refsubexpfin_
                    (in_RCX,in_stack_ffffffffffffffde,in_stack_ffffffffffffffdc,
                     in_stack_ffffffffffffffda);
  in_RSI[5] = uVar1 - 0x17;
  in_RSI[1] = uVar1 - 0x17;
  uVar1 = aom_read_primitive_refsubexpfin_
                    (in_RCX,in_stack_ffffffffffffffde,in_stack_ffffffffffffffdc,
                     in_stack_ffffffffffffffda);
  in_RSI[4] = uVar1 - 0x11;
  in_RSI[2] = uVar1 - 0x11;
  in_RSI[3] = (*in_RSI + in_RSI[1] + in_RSI[2]) * -2;
  if (in_EDI == 7) {
    uVar1 = aom_read_primitive_refsubexpfin_
                      (in_RCX,in_stack_ffffffffffffffde,in_stack_ffffffffffffffdc,
                       in_stack_ffffffffffffffda);
    in_RSI[0xe] = uVar1 - 5;
    in_RSI[8] = uVar1 - 5;
  }
  else {
    in_RSI[0xe] = 0;
    in_RSI[8] = 0;
  }
  uVar1 = aom_read_primitive_refsubexpfin_
                    (in_RCX,in_stack_ffffffffffffffde,in_stack_ffffffffffffffdc,
                     in_stack_ffffffffffffffda);
  in_RSI[0xd] = uVar1 - 0x17;
  in_RSI[9] = uVar1 - 0x17;
  uVar1 = aom_read_primitive_refsubexpfin_
                    (in_RCX,in_stack_ffffffffffffffde,in_stack_ffffffffffffffdc,
                     in_stack_ffffffffffffffda);
  in_RSI[0xc] = uVar1 - 0x11;
  in_RSI[10] = uVar1 - 0x11;
  in_RSI[0xb] = (in_RSI[8] + in_RSI[9] + in_RSI[10]) * -2;
  *in_RDX = *(undefined8 *)in_RSI;
  in_RDX[1] = *(undefined8 *)(in_RSI + 4);
  in_RDX[2] = *(undefined8 *)(in_RSI + 8);
  in_RDX[3] = *(undefined8 *)(in_RSI + 0xc);
  return;
}

Assistant:

static inline void read_wiener_filter(int wiener_win, WienerInfo *wiener_info,
                                      WienerInfo *ref_wiener_info,
                                      aom_reader *rb) {
  memset(wiener_info->vfilter, 0, sizeof(wiener_info->vfilter));
  memset(wiener_info->hfilter, 0, sizeof(wiener_info->hfilter));

  if (wiener_win == WIENER_WIN)
    wiener_info->vfilter[0] = wiener_info->vfilter[WIENER_WIN - 1] =
        aom_read_primitive_refsubexpfin(
            rb, WIENER_FILT_TAP0_MAXV - WIENER_FILT_TAP0_MINV + 1,
            WIENER_FILT_TAP0_SUBEXP_K,
            ref_wiener_info->vfilter[0] - WIENER_FILT_TAP0_MINV, ACCT_STR) +
        WIENER_FILT_TAP0_MINV;
  else
    wiener_info->vfilter[0] = wiener_info->vfilter[WIENER_WIN - 1] = 0;
  wiener_info->vfilter[1] = wiener_info->vfilter[WIENER_WIN - 2] =
      aom_read_primitive_refsubexpfin(
          rb, WIENER_FILT_TAP1_MAXV - WIENER_FILT_TAP1_MINV + 1,
          WIENER_FILT_TAP1_SUBEXP_K,
          ref_wiener_info->vfilter[1] - WIENER_FILT_TAP1_MINV, ACCT_STR) +
      WIENER_FILT_TAP1_MINV;
  wiener_info->vfilter[2] = wiener_info->vfilter[WIENER_WIN - 3] =
      aom_read_primitive_refsubexpfin(
          rb, WIENER_FILT_TAP2_MAXV - WIENER_FILT_TAP2_MINV + 1,
          WIENER_FILT_TAP2_SUBEXP_K,
          ref_wiener_info->vfilter[2] - WIENER_FILT_TAP2_MINV, ACCT_STR) +
      WIENER_FILT_TAP2_MINV;
  // The central element has an implicit +WIENER_FILT_STEP
  wiener_info->vfilter[WIENER_HALFWIN] =
      -2 * (wiener_info->vfilter[0] + wiener_info->vfilter[1] +
            wiener_info->vfilter[2]);

  if (wiener_win == WIENER_WIN)
    wiener_info->hfilter[0] = wiener_info->hfilter[WIENER_WIN - 1] =
        aom_read_primitive_refsubexpfin(
            rb, WIENER_FILT_TAP0_MAXV - WIENER_FILT_TAP0_MINV + 1,
            WIENER_FILT_TAP0_SUBEXP_K,
            ref_wiener_info->hfilter[0] - WIENER_FILT_TAP0_MINV, ACCT_STR) +
        WIENER_FILT_TAP0_MINV;
  else
    wiener_info->hfilter[0] = wiener_info->hfilter[WIENER_WIN - 1] = 0;
  wiener_info->hfilter[1] = wiener_info->hfilter[WIENER_WIN - 2] =
      aom_read_primitive_refsubexpfin(
          rb, WIENER_FILT_TAP1_MAXV - WIENER_FILT_TAP1_MINV + 1,
          WIENER_FILT_TAP1_SUBEXP_K,
          ref_wiener_info->hfilter[1] - WIENER_FILT_TAP1_MINV, ACCT_STR) +
      WIENER_FILT_TAP1_MINV;
  wiener_info->hfilter[2] = wiener_info->hfilter[WIENER_WIN - 3] =
      aom_read_primitive_refsubexpfin(
          rb, WIENER_FILT_TAP2_MAXV - WIENER_FILT_TAP2_MINV + 1,
          WIENER_FILT_TAP2_SUBEXP_K,
          ref_wiener_info->hfilter[2] - WIENER_FILT_TAP2_MINV, ACCT_STR) +
      WIENER_FILT_TAP2_MINV;
  // The central element has an implicit +WIENER_FILT_STEP
  wiener_info->hfilter[WIENER_HALFWIN] =
      -2 * (wiener_info->hfilter[0] + wiener_info->hfilter[1] +
            wiener_info->hfilter[2]);
  memcpy(ref_wiener_info, wiener_info, sizeof(*wiener_info));
}